

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcess.cxx
# Opt level: O2

int __thiscall cmProcess::ReportStatus(cmProcess *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  char *pcVar5;
  
  iVar1 = cmsysProcess_GetState(this->Process);
  iVar2 = 1;
  switch(iVar1) {
  case 0:
    pcVar5 = "cmProcess: Never started ";
    goto LAB_0030b60c;
  case 1:
    poVar4 = std::operator<<((ostream *)&std::cerr,"cmProcess: Error executing ");
    poVar4 = std::operator<<(poVar4,(string *)&this->Command);
    poVar4 = std::operator<<(poVar4," process: ");
    pcVar5 = cmsysProcess_GetErrorString(this->Process);
    poVar4 = std::operator<<(poVar4,pcVar5);
    goto LAB_0030b5ca;
  case 2:
    poVar4 = std::operator<<((ostream *)&std::cerr,"cmProcess: ");
    poVar4 = std::operator<<(poVar4,(string *)&this->Command);
    std::operator<<(poVar4," process exited with an exception: ");
    uVar3 = cmsysProcess_GetExitException(this->Process);
    if (uVar3 < 6) {
      std::operator<<((ostream *)&std::cerr,
                      &DAT_00526978 + *(int *)(&DAT_00526978 + (ulong)uVar3 * 4));
    }
    poVar4 = (ostream *)&std::cerr;
    pcVar5 = "\n";
    break;
  case 3:
    pcVar5 = "cmProcess: Never terminated ";
    goto LAB_0030b60c;
  case 4:
    iVar2 = cmsysProcess_GetExitValue(this->Process);
    poVar4 = std::operator<<((ostream *)&std::cerr,"cmProcess: ");
    poVar4 = std::operator<<(poVar4,(string *)&this->Command);
    poVar4 = std::operator<<(poVar4," process exited with code ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
LAB_0030b5ca:
    pcVar5 = "\n";
    break;
  case 5:
    poVar4 = std::operator<<((ostream *)&std::cerr,"cmProcess: killed ");
    poVar4 = std::operator<<(poVar4,(string *)&this->Command);
    pcVar5 = " process due to timeout.\n";
    break;
  case 6:
    pcVar5 = "cmProcess: killed ";
LAB_0030b60c:
    poVar4 = std::operator<<((ostream *)&std::cerr,pcVar5);
    poVar4 = std::operator<<(poVar4,(string *)&this->Command);
    pcVar5 = " process.\n";
    break;
  default:
    goto switchD_0030b4a7_default;
  }
  std::operator<<(poVar4,pcVar5);
switchD_0030b4a7_default:
  return iVar2;
}

Assistant:

int cmProcess::ReportStatus()
{
  int result = 1;
  switch(cmsysProcess_GetState(this->Process))
    {
    case cmsysProcess_State_Starting:
      {
      std::cerr << "cmProcess: Never started "
           << this->Command << " process.\n";
      } break;
    case cmsysProcess_State_Error:
      {
      std::cerr << "cmProcess: Error executing " << this->Command
                << " process: "
                << cmsysProcess_GetErrorString(this->Process)
                << "\n";
      } break;
    case cmsysProcess_State_Exception:
      {
      std::cerr << "cmProcess: " << this->Command
                      << " process exited with an exception: ";
      switch(cmsysProcess_GetExitException(this->Process))
        {
        case cmsysProcess_Exception_None:
          {
          std::cerr << "None";
          } break;
        case cmsysProcess_Exception_Fault:
          {
          std::cerr << "Segmentation fault";
          } break;
        case cmsysProcess_Exception_Illegal:
          {
          std::cerr << "Illegal instruction";
          } break;
        case cmsysProcess_Exception_Interrupt:
          {
          std::cerr << "Interrupted by user";
          } break;
        case cmsysProcess_Exception_Numerical:
          {
          std::cerr << "Numerical exception";
          } break;
        case cmsysProcess_Exception_Other:
          {
          std::cerr << "Unknown";
          } break;
        }
      std::cerr << "\n";
      } break;
    case cmsysProcess_State_Executing:
      {
      std::cerr << "cmProcess: Never terminated " <<
        this->Command << " process.\n";
      } break;
    case cmsysProcess_State_Exited:
      {
      result = cmsysProcess_GetExitValue(this->Process);
      std::cerr << "cmProcess: " << this->Command
                << " process exited with code "
                << result << "\n";
      } break;
    case cmsysProcess_State_Expired:
      {
      std::cerr << "cmProcess: killed " << this->Command
                << " process due to timeout.\n";
      } break;
    case cmsysProcess_State_Killed:
      {
      std::cerr << "cmProcess: killed " << this->Command << " process.\n";
      } break;
    }
  return result;

}